

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

int count_unpaid(obj *list)

{
  int iVar1;
  int local_14;
  obj *poStack_10;
  int count;
  obj *list_local;
  
  local_14 = 0;
  for (poStack_10 = list; poStack_10 != (obj *)0x0; poStack_10 = poStack_10->nobj) {
    if ((*(uint *)&poStack_10->field_0x4a >> 2 & 1) != 0) {
      local_14 = local_14 + 1;
    }
    if (poStack_10->cobj != (obj *)0x0) {
      iVar1 = count_unpaid(poStack_10->cobj);
      local_14 = iVar1 + local_14;
    }
  }
  return local_14;
}

Assistant:

int count_unpaid(struct obj *list)
{
    int count = 0;

    while (list) {
	if (list->unpaid) count++;
	if (Has_contents(list))
	    count += count_unpaid(list->cobj);
	list = list->nobj;
    }
    return count;
}